

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

cmListFileBacktrace * __thiscall
cmListFileBacktrace::operator=(cmListFileBacktrace *this,cmListFileBacktrace *r)

{
  Entry *this_00;
  PositionType PVar1;
  cmState *pcVar2;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar3;
  cmStateSnapshot __tmp;
  cmListFileBacktrace tmp;
  cmListFileBacktrace local_38;
  
  cmListFileBacktrace(&local_38,r);
  this_00 = this->Cur;
  this->Cur = local_38.Cur;
  PVar1 = (this->Bottom).Position.Position;
  pcVar2 = (this->Bottom).State;
  pcVar3 = (this->Bottom).Position.Tree;
  (this->Bottom).Position.Position = local_38.Bottom.Position.Position;
  (this->Bottom).State = local_38.Bottom.State;
  (this->Bottom).Position.Tree = local_38.Bottom.Position.Tree;
  if (this_00 != (Entry *)0x0) {
    local_38.Bottom.State = pcVar2;
    local_38.Bottom.Position.Tree = pcVar3;
    local_38.Bottom.Position.Position = PVar1;
    local_38.Cur = this_00;
    Entry::Unref(this_00);
  }
  return this;
}

Assistant:

cmListFileBacktrace& cmListFileBacktrace::operator=(
  cmListFileBacktrace const& r)
{
  cmListFileBacktrace tmp(r);
  std::swap(this->Cur, tmp.Cur);
  std::swap(this->Bottom, tmp.Bottom);
  return *this;
}